

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsound_mame.c
# Opt level: O2

void device_reset_qsound(void *info)

{
  byte *pbVar1;
  long lVar2;
  qsound_state *chip;
  uint MuteMask;
  int iVar3;
  
  pbVar1 = (byte *)((long)info + 0x28);
  MuteMask = 0;
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
    MuteMask = MuteMask | (uint)*pbVar1 << ((byte)lVar2 & 0x1f);
    pbVar1 = pbVar1 + 0x24;
  }
  memset((void *)((long)info + 8),0,0x240);
  qsound_set_mute_mask(info,MuteMask);
  for (iVar3 = 0x7f; -1 < iVar3; iVar3 = iVar3 + -1) {
    qsound_write_data(info,(UINT8)iVar3,0);
  }
  for (iVar3 = -0x10; iVar3 != 0; iVar3 = iVar3 + 1) {
    qsound_write_data(info,(char)iVar3 + 0x90,0x120);
  }
  return;
}

Assistant:

static void device_reset_qsound(void *info)
{
	qsound_state *chip = (qsound_state *)info;
	UINT32 muteMask;
	int adr;

	muteMask = qsound_get_mute_mask(chip);
	// init sound regs
	memset(chip->channel, 0, sizeof(chip->channel));
	qsound_set_mute_mask(chip, muteMask);

	for (adr = 0x7f; adr >= 0; adr--)
		qsound_write_data(chip, adr, 0);
	for (adr = 0x80; adr < 0x90; adr++)
		qsound_write_data(chip, adr, 0x120);

	return;
}